

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_device_changed_callback.cpp
# Opt level: O2

void test_registering_and_unregistering_callback(cubeb_stream *stream)

{
  Message *pMVar1;
  anon_enum_32 *in_RCX;
  char *pcVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  int r;
  AssertionResult gtest_ar;
  AssertHelper local_20;
  
  r = cubeb_stream_register_device_changed_callback(stream,device_changed_callback);
  if (r != -4) {
    local_40.ptr_._0_4_ = 0;
    testing::internal::EqHelper<false>::Compare<int,__0>
              (&gtest_ar.success_,(char *)&r,(int *)&local_40,in_RCX);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_40);
      pMVar1 = testing::Message::operator<<
                         ((Message *)&local_40,
                          (char (*) [42])"Error registering device changed callback");
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_device_changed_callback.cpp"
                 ,0x3f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_20,pMVar1);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_40);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      r = cubeb_stream_register_device_changed_callback(stream,(cubeb_device_changed_callback)0x0);
      local_40.ptr_._0_4_ = 0;
      testing::internal::EqHelper<false>::Compare<int,__0>
                (&gtest_ar.success_,(char *)&r,(int *)&local_40,in_RCX);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_40);
        pMVar1 = testing::Message::operator<<
                           ((Message *)&local_40,
                            (char (*) [44])"Error unregistering device changed callback");
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_20,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_device_changed_callback.cpp"
                   ,0x42,pcVar2);
        testing::internal::AssertHelper::operator=(&local_20,pMVar1);
        testing::internal::AssertHelper::~AssertHelper(&local_20);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_40);
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

void test_registering_and_unregistering_callback(cubeb_stream * stream)
{
  int r = cubeb_stream_register_device_changed_callback(stream, device_changed_callback);
  if (r == CUBEB_ERROR_NOT_SUPPORTED) {
    return;
  }
  ASSERT_EQ(r, CUBEB_OK) << "Error registering device changed callback";

  r = cubeb_stream_register_device_changed_callback(stream, nullptr);
  ASSERT_EQ(r, CUBEB_OK) << "Error unregistering device changed callback";
}